

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP5Serializer.cpp
# Opt level: O2

void __thiscall adios2::format::BP5Serializer::InitStep(BP5Serializer *this,BufferV *DataBuffer)

{
  allocator local_94;
  allocator local_93;
  allocator local_92;
  allocator local_91;
  string local_90;
  string local_70;
  string local_50;
  string local_30;
  
  if (this->CurDataBuffer != (BufferV *)0x0) {
    std::__cxx11::string::string((string *)&local_30,"Toolkit",&local_91);
    std::__cxx11::string::string((string *)&local_50,"format::BP5Serializer",&local_92);
    std::__cxx11::string::string((string *)&local_70,"InitStep",&local_93);
    std::__cxx11::string::string((string *)&local_90,"without prior Close",&local_94);
    helper::Throw<std::logic_error>(&local_30,&local_50,&local_70,&local_90,-1);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_30);
  }
  this->CurDataBuffer = DataBuffer;
  this->m_PriorDataBufferSizeTotal = 0;
  return;
}

Assistant:

void BP5Serializer::InitStep(BufferV *DataBuffer)
{
    if (CurDataBuffer != NULL)
    {
        helper::Throw<std::logic_error>("Toolkit", "format::BP5Serializer", "InitStep",
                                        "without prior Close");
    }
    CurDataBuffer = DataBuffer;
    m_PriorDataBufferSizeTotal = 0;
}